

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

Oop __thiscall Lodtalk::Behavior::superLookupSelector(Behavior *this,Oop selector)

{
  bool bVar1;
  Behavior *this_local;
  Oop selector_local;
  
  bVar1 = isNil((ProtoObject *)this->superclass);
  if (bVar1) {
    selector_local = nilOop();
  }
  else {
    selector_local = lookupSelector(this->superclass,selector);
  }
  return (Oop)selector_local.field_0.pointer;
}

Assistant:

Oop Behavior::superLookupSelector(Oop selector)
{
	// Find in the super class.
	if(isNil(superclass))
		return nilOop();
	return superclass->lookupSelector(selector);
}